

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O1

void sat_solver2_setnvars(sat_solver2 *s,int n)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  veci *pvVar4;
  varinfo2 *pvVar5;
  int *piVar6;
  char *pcVar7;
  lit *plVar8;
  cla *pcVar9;
  uint *puVar10;
  long lVar11;
  size_t sVar12;
  uint uVar13;
  uint uVar14;
  veci *pvVar15;
  int iVar16;
  ulong uVar17;
  
  iVar16 = s->cap;
  if (iVar16 < n) {
    iVar3 = s->cap;
    if (iVar3 < n) {
      do {
        iVar3 = iVar3 * 2 + 1;
      } while (iVar3 < n);
      s->cap = iVar3;
    }
    sVar12 = (long)(iVar3 * 2) << 4;
    if (s->wlists == (veci *)0x0) {
      pvVar4 = (veci *)malloc(sVar12);
    }
    else {
      pvVar4 = (veci *)realloc(s->wlists,sVar12);
    }
    s->wlists = pvVar4;
    sVar12 = (long)s->cap << 2;
    if (s->vi == (varinfo2 *)0x0) {
      pvVar5 = (varinfo2 *)malloc(sVar12);
    }
    else {
      pvVar5 = (varinfo2 *)realloc(s->vi,sVar12);
    }
    s->vi = pvVar5;
    sVar12 = (long)s->cap << 2;
    if (s->levels == (int *)0x0) {
      piVar6 = (int *)malloc(sVar12);
    }
    else {
      piVar6 = (int *)realloc(s->levels,sVar12);
    }
    s->levels = piVar6;
    if (s->assigns == (char *)0x0) {
      pcVar7 = (char *)malloc((long)s->cap);
    }
    else {
      pcVar7 = (char *)realloc(s->assigns,(long)s->cap);
    }
    s->assigns = pcVar7;
    sVar12 = (long)s->cap << 2;
    if (s->trail == (lit *)0x0) {
      plVar8 = (lit *)malloc(sVar12);
    }
    else {
      plVar8 = (lit *)realloc(s->trail,sVar12);
    }
    s->trail = plVar8;
    sVar12 = (long)s->cap << 2;
    if (s->orderpos == (int *)0x0) {
      piVar6 = (int *)malloc(sVar12);
    }
    else {
      piVar6 = (int *)realloc(s->orderpos,sVar12);
    }
    s->orderpos = piVar6;
    sVar12 = (long)s->cap << 2;
    if (s->reasons == (cla *)0x0) {
      pcVar9 = (cla *)malloc(sVar12);
    }
    else {
      pcVar9 = (cla *)realloc(s->reasons,sVar12);
    }
    s->reasons = pcVar9;
    if (s->fProofLogging != 0) {
      sVar12 = (long)s->cap << 2;
      if (s->units == (cla *)0x0) {
        pcVar9 = (cla *)malloc(sVar12);
      }
      else {
        pcVar9 = (cla *)realloc(s->units,sVar12);
      }
      s->units = pcVar9;
    }
    sVar12 = (long)s->cap << 2;
    if (s->activity == (uint *)0x0) {
      puVar10 = (uint *)malloc(sVar12);
    }
    else {
      puVar10 = (uint *)realloc(s->activity,sVar12);
    }
    s->activity = puVar10;
    sVar12 = (long)s->cap << 2;
    if (s->activity2 == (uint *)0x0) {
      puVar10 = (uint *)malloc(sVar12);
    }
    else {
      puVar10 = (uint *)realloc(s->activity2,sVar12);
    }
    s->activity2 = puVar10;
    sVar12 = (long)s->cap << 2;
    if (s->model == (int *)0x0) {
      piVar6 = (int *)malloc(sVar12);
    }
    else {
      piVar6 = (int *)realloc(s->model,sVar12);
    }
    s->model = piVar6;
    memset(s->wlists + (long)iVar16 * 2,0,((long)s->cap - (long)iVar16) * 0x20);
  }
  lVar11 = (long)s->size;
  if (s->size < n) {
    do {
      pvVar4 = s->wlists;
      if (pvVar4[lVar11 * 2].size != 0) {
        __assert_fail("!s->wlists[2*var].size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                      ,0x4ae,"void sat_solver2_setnvars(sat_solver2 *, int)");
      }
      uVar17 = lVar11 * 2 | 1;
      if (pvVar4[uVar17].size != 0) {
        __assert_fail("!s->wlists[2*var+1].size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                      ,0x4af,"void sat_solver2_setnvars(sat_solver2 *, int)");
      }
      pvVar15 = pvVar4 + lVar11 * 2;
      if (pvVar15->ptr == (int *)0x0) {
        pvVar15->cap = 4;
        pvVar15->size = 0;
        piVar6 = (int *)malloc(0x10);
        pvVar15->ptr = piVar6;
      }
      if (pvVar4[uVar17].ptr == (int *)0x0) {
        pvVar4 = pvVar4 + uVar17;
        pvVar4->cap = 4;
        pvVar4->size = 0;
        piVar6 = (int *)malloc(0x10);
        pvVar4->ptr = piVar6;
      }
      s->vi[lVar11] = (varinfo2)0x0;
      s->levels[lVar11] = 0;
      s->assigns[lVar11] = '\x03';
      s->reasons[lVar11] = 0;
      if (s->fProofLogging != 0) {
        s->units[lVar11] = 0;
      }
      s->activity[lVar11] = 0x400;
      s->model[lVar11] = 0;
      s->orderpos[lVar11] = (s->order).size;
      uVar14 = (s->order).cap;
      if ((s->order).size == uVar14) {
        iVar16 = (uVar14 >> 1) * 3;
        if ((int)uVar14 < 4) {
          iVar16 = uVar14 * 2;
        }
        piVar6 = (s->order).ptr;
        if (piVar6 == (int *)0x0) {
          piVar6 = (int *)malloc((long)iVar16 << 2);
        }
        else {
          piVar6 = (int *)realloc(piVar6,(long)iVar16 << 2);
        }
        (s->order).ptr = piVar6;
        if (piVar6 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)(s->order).cap * 9.5367431640625e-07,(double)iVar16 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->order).cap = iVar16;
      }
      iVar16 = (s->order).size;
      (s->order).size = iVar16 + 1;
      (s->order).ptr[iVar16] = (int)lVar11;
      piVar6 = s->orderpos;
      piVar1 = (s->order).ptr;
      uVar14 = piVar6[lVar11];
      uVar17 = (ulong)(int)uVar14;
      iVar16 = piVar1[uVar17];
      if (uVar17 != 0) {
        if (uVar14 == 0xffffffff) {
          __assert_fail("s->orderpos[v] != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                        ,0xf2,"void order_update(sat_solver2 *, int)");
        }
        puVar10 = s->activity;
        do {
          uVar2 = (uint)uVar17;
          uVar13 = (int)((uVar2 - ((int)(uVar2 - 1) >> 0x1f)) + -1) >> 1;
          iVar3 = piVar1[(int)uVar13];
          uVar14 = uVar2;
          if (puVar10[iVar16] <= puVar10[iVar3]) break;
          piVar1[(int)uVar2] = iVar3;
          piVar6[iVar3] = uVar2;
          uVar17 = (ulong)uVar13;
          uVar14 = uVar13;
        } while (2 < uVar2);
      }
      piVar1[(int)uVar14] = iVar16;
      piVar6[iVar16] = uVar14;
      lVar11 = lVar11 + 1;
    } while ((int)lVar11 != n);
  }
  if (n < s->size) {
    n = s->size;
  }
  s->size = n;
  return;
}

Assistant:

void sat_solver2_setnvars(sat_solver2* s,int n)
{
    int var;

    if (s->cap < n){
        int old_cap = s->cap;
        while (s->cap < n) s->cap = s->cap*2+1;

        s->wlists    = ABC_REALLOC(veci,     s->wlists,   s->cap*2);
        s->vi        = ABC_REALLOC(varinfo2, s->vi,       s->cap);
        s->levels    = ABC_REALLOC(int,      s->levels,   s->cap);
        s->assigns   = ABC_REALLOC(char,     s->assigns,  s->cap);
        s->trail     = ABC_REALLOC(lit,      s->trail,    s->cap);
        s->orderpos  = ABC_REALLOC(int,      s->orderpos, s->cap);
        s->reasons   = ABC_REALLOC(cla,      s->reasons,  s->cap);
        if ( s->fProofLogging )
        s->units     = ABC_REALLOC(cla,      s->units,    s->cap);
#ifdef USE_FLOAT_ACTIVITY2
        s->activity  = ABC_REALLOC(double,   s->activity, s->cap);
#else
        s->activity  = ABC_REALLOC(unsigned, s->activity, s->cap);
        s->activity2 = ABC_REALLOC(unsigned, s->activity2,s->cap);
#endif
        s->model     = ABC_REALLOC(int,      s->model,    s->cap);
        memset( s->wlists + 2*old_cap, 0, 2*(s->cap-old_cap)*sizeof(vecp) );
    }

    for (var = s->size; var < n; var++){
        assert(!s->wlists[2*var].size);
        assert(!s->wlists[2*var+1].size);
        if ( s->wlists[2*var].ptr == NULL )
            veci_new(&s->wlists[2*var]);
        if ( s->wlists[2*var+1].ptr == NULL )
            veci_new(&s->wlists[2*var+1]);
        *((int*)s->vi + var) = 0; //s->vi[var].val = varX;
        s->levels  [var] = 0;
        s->assigns [var] = varX;
        s->reasons [var] = 0;
        if ( s->fProofLogging )
        s->units   [var] = 0;
#ifdef USE_FLOAT_ACTIVITY2
        s->activity[var] = 0;
#else
        s->activity[var] = (1<<10);
#endif
        s->model   [var] = 0;
        // does not hold because variables enqueued at top level will not be reinserted in the heap
        // assert(veci_size(&s->order) == var); 
        s->orderpos[var] = veci_size(&s->order);
        veci_push(&s->order,var);
        order_update(s, var);
    }
    s->size = n > s->size ? n : s->size;
}